

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_pubkey_load(secp256k1_context *ctx,secp256k1_ge *ge,secp256k1_pubkey *pubkey)

{
  int iVar1;
  secp256k1_ge_storage s;
  
  s.x.n[0] = *(uint64_t *)pubkey->data;
  s.x.n[1] = *(uint64_t *)(pubkey->data + 8);
  s.x.n[2] = *(uint64_t *)(pubkey->data + 0x10);
  s.x.n[3] = *(uint64_t *)(pubkey->data + 0x18);
  s.y.n[0] = *(uint64_t *)(pubkey->data + 0x20);
  s.y.n[1] = *(uint64_t *)(pubkey->data + 0x28);
  s.y.n[2] = *(uint64_t *)(pubkey->data + 0x30);
  s.y.n[3] = *(uint64_t *)(pubkey->data + 0x38);
  secp256k1_ge_from_storage(ge,&s);
  iVar1 = secp256k1_fe_impl_is_zero(&ge->x);
  if (iVar1 != 0) {
    (*(ctx->illegal_callback).fn)("!secp256k1_fe_is_zero(&ge->x)",(ctx->illegal_callback).data);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

static int secp256k1_pubkey_load(const secp256k1_context* ctx, secp256k1_ge* ge, const secp256k1_pubkey* pubkey) {
    secp256k1_ge_storage s;

    /* We require that the secp256k1_ge_storage type is exactly 64 bytes.
     * This is formally not guaranteed by the C standard, but should hold on any
     * sane compiler in the real world. */
    STATIC_ASSERT(sizeof(secp256k1_ge_storage) == 64);
    memcpy(&s, &pubkey->data[0], 64);
    secp256k1_ge_from_storage(ge, &s);
    ARG_CHECK(!secp256k1_fe_is_zero(&ge->x));
    return 1;
}